

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.hpp
# Opt level: O2

optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>
unodb::detail::impl_helpers::
remove_or_choose_subtree<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::detail::inode_256<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
          (inode_256<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *inode,
          byte key_byte,basic_art_key<unsigned_long> k,
          db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *db_instance,
          node_ptr *node_in_parent)

{
  basic_leaf<unsigned_long,_unodb::detail::node_header> *this;
  _Tuple_impl<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ptr_;
  _Storage<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true> _Var1;
  uintptr_t uVar2;
  undefined8 uVar3;
  undefined7 in_register_00000031;
  uint8_t key_int_byte;
  optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*> oVar4;
  basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>
  local_50 [8];
  db_inode_unique_ptr<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte>_>_> new_node
  ;
  undefined7 extraout_var;
  
  _Var1._M_value =
       &(inode->super_inode_256_parent<unsigned_long,_std::span<const_std::byte>_>).children.
        _M_elems[CONCAT71(in_register_00000031,key_byte) & 0xffffffff].value;
  this = (basic_leaf<unsigned_long,_unodb::detail::node_header> *)
         ((basic_node_ptr<unodb::detail::node_header> *)&(_Var1._M_value)->tagged_ptr)->tagged_ptr;
  uVar3 = 0;
  new_node._M_t.
  super___uniq_ptr_impl<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
  .
  super__Head_base<0UL,_unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
  ._M_head_impl._0_1_ =
       -(this == (basic_leaf<unsigned_long,_unodb::detail::node_header> *)0x0) | key_byte;
  if ((this != (basic_leaf<unsigned_long,_unodb::detail::node_header> *)0x0) &&
     (uVar3 = 1, ((ulong)this & 7) == 0)) {
    _Var1._0_1_ = basic_leaf<unsigned_long,_unodb::detail::node_header>::matches
                            (this,(art_key_type)k.field_0);
    _Var1._1_7_ = extraout_var;
    if (_Var1._0_1_) {
      if ((inode->super_inode_256_parent<unsigned_long,_std::span<const_std::byte>_>).
          super_basic_inode_256_parent<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
          .
          super_basic_inode_impl<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
          .children_count.value == '1') {
        basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>
        ::
        make_db_inode_unique_ptr<unodb::detail::inode_48<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>,unodb::detail::inode_256<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>&,unsigned_char_const&>
                  (local_50,db_instance,inode,
                   (uchar *)&new_node._M_t.
                             super___uniq_ptr_impl<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                             .
                             super__Head_base<0UL,_unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_false>
                  );
        ptr_ = new_node._M_t.
               super___uniq_ptr_impl<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
               .
               super__Tuple_impl<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
        ;
        new_node._M_t.
        super___uniq_ptr_impl<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_*,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
        .
        super__Tuple_impl<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
        .
        super__Head_base<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
        ._M_head_impl.db =
             (_Head_base<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
              )(basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                )0x0;
        uVar2 = basic_node_ptr<unodb::detail::node_header>::tag_ptr
                          ((node_header *)
                           ptr_.
                           super__Head_base<1UL,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_false>
                           ._M_head_impl.db,I48);
        node_in_parent->tagged_ptr = uVar2;
        std::
        unique_ptr<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
        ::~unique_ptr((unique_ptr<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::detail::basic_db_inode_deleter<unodb::detail::inode_48<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                       *)local_50);
        db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::
        account_shrinking_inode<(unodb::node_type)4>(db_instance);
      }
      else {
        basic_inode_256<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
        ::remove(&inode->super_inode_256_parent<unsigned_long,_std::span<const_std::byte>_>,
                 (char *)(ulong)key_byte);
      }
      _Var1._M_value = (basic_node_ptr<unodb::detail::node_header> *)0x0;
    }
    else {
      uVar3 = 0;
    }
  }
  oVar4.
  super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>.
  _M_payload.
  super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>._8_8_ =
       uVar3;
  oVar4.
  super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>.
  _M_payload.
  super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>.
  _M_payload._M_value = _Var1._M_value;
  return (optional<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>)
         oVar4.
         super__Optional_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*,_true,_true>
         ._M_payload.
         super__Optional_payload_base<unodb::detail::basic_node_ptr<unodb::detail::node_header>_*>;
}

Assistant:

std::optional<detail::node_ptr*> impl_helpers::remove_or_choose_subtree(
    INode& inode, std::byte key_byte, basic_art_key<Key> k,
    db<Key, Value>& db_instance, detail::node_ptr* node_in_parent) {
  const auto [child_i, child_ptr]{inode.find_child(key_byte)};

  if (child_ptr == nullptr) return {};

  const auto child_ptr_val{child_ptr->load()};
  if (child_ptr_val.type() != node_type::LEAF)
    return unwrap_fake_critical_section(child_ptr);

  const auto* const leaf{
      child_ptr_val.template ptr<typename db<Key, Value>::leaf_type*>()};
  if (!leaf->matches(k)) return {};

  if (UNODB_DETAIL_UNLIKELY(inode.is_min_size())) {
    if constexpr (std::is_same_v<INode, inode_4<Key, Value>>) {
      auto current_node{art_policy<Key, Value>::make_db_inode_unique_ptr(
          &inode, db_instance)};
      *node_in_parent = current_node->leave_last_child(child_i, db_instance);
    } else {
      auto new_node{
          INode::smaller_derived_type::create(db_instance, inode, child_i)};
      *node_in_parent =
          node_ptr{new_node.release(), INode::smaller_derived_type::type};
    }
#ifdef UNODB_DETAIL_WITH_STATS
    db_instance.template account_shrinking_inode<INode::type>();
#endif  // UNODB_DETAIL_WITH_STATS
    return nullptr;
  }

  inode.remove(child_i, db_instance);
  return nullptr;
}